

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * decNaNs(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint32_t *status)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint8_t *puVar4;
  
  if ((lhs->bits & 0x10) == 0) {
    if (rhs != (decNumber *)0x0) {
      if ((rhs->bits & 0x10) == 0) {
        if ((lhs->bits & 0x20) == 0) {
          lhs = rhs;
        }
      }
      else {
        *status = *status | 0x40000080;
        lhs = rhs;
      }
    }
  }
  else {
    *status = *status | 0x40000080;
  }
  uVar1 = set->digits;
  if ((int)uVar1 < lhs->digits) {
    res->bits = lhs->bits;
    if ((int)uVar1 < 0x32) {
      uVar1 = (uint)""[(int)uVar1];
    }
    if (uVar1 != 0) {
      puVar2 = res->lsu;
      puVar4 = lhs->lsu;
      do {
        *puVar2 = *puVar4;
        puVar2 = puVar2 + 1;
        puVar4 = puVar4 + 1;
      } while (puVar2 < res->lsu + uVar1);
    }
    uVar1 = set->digits;
    uVar3 = uVar1;
    if ((long)(int)uVar1 < 0x32) {
      uVar3 = (uint)""[(int)uVar1];
    }
    res->digits = uVar3;
    if (uVar3 - uVar1 != 0 && (int)uVar1 <= (int)uVar3) {
      decDecap(res,uVar3 - uVar1);
    }
  }
  else {
    uprv_decNumberCopy_63(res,lhs);
  }
  res->bits = res->bits & 0xcf | 0x20;
  res->exponent = 0;
  return res;
}

Assistant:

static decNumber * decNaNs(decNumber *res, const decNumber *lhs,
                           const decNumber *rhs, decContext *set,
                           uInt *status) {
  /* This decision tree ends up with LHS being the source pointer,  */
  /* and status updated if need be  */
  if (lhs->bits & DECSNAN)
    *status|=DEC_Invalid_operation | DEC_sNaN;
   else if (rhs==NULL);
   else if (rhs->bits & DECSNAN) {
    lhs=rhs;
    *status|=DEC_Invalid_operation | DEC_sNaN;
    }
   else if (lhs->bits & DECNAN);
   else lhs=rhs;

  /* propagate the payload  */
  if (lhs->digits<=set->digits) uprv_decNumberCopy(res, lhs); /* easy  */
   else { /* too long  */
    const Unit *ul;
    Unit *ur, *uresp1;
    /* copy safe number of units, then decapitate  */
    res->bits=lhs->bits;                /* need sign etc.  */
    uresp1=res->lsu+D2U(set->digits);
    for (ur=res->lsu, ul=lhs->lsu; ur<uresp1; ur++, ul++) *ur=*ul;
    res->digits=D2U(set->digits)*DECDPUN;
    /* maybe still too long  */
    if (res->digits>set->digits) decDecap(res, res->digits-set->digits);
    }

  res->bits&=~DECSNAN;        /* convert any sNaN to NaN, while  */
  res->bits|=DECNAN;          /* .. preserving sign  */
  res->exponent=0;            /* clean exponent  */
                              /* [coefficient was copied/decapitated]  */
  return res;
  }